

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O2

int double_conversion::CompareBufferWithDiyFp(Vector<const_char> buffer,int exponent,DiyFp diy_fp)

{
  int iVar1;
  Bignum *this;
  Bignum *this_00;
  Vector<const_char> value;
  Bignum diy_fp_bignum;
  Bignum buffer_bignum;
  Bignum local_428;
  Bignum local_224;
  
  this = &local_428;
  this_00 = &local_428;
  iVar1 = diy_fp.e_;
  value._8_8_ = buffer._8_8_ & 0xffffffff;
  local_224.used_bigits_ = 0;
  local_224.exponent_ = 0;
  local_428.used_bigits_ = 0;
  local_428.exponent_ = 0;
  value.start_ = buffer.start_;
  Bignum::AssignDecimalString(&local_224,value);
  Bignum::AssignUInt64(&local_428,diy_fp.f_);
  if (exponent < 0) {
    exponent = -exponent;
  }
  else {
    this = &local_224;
  }
  Bignum::MultiplyByPowerOfTen(this,exponent);
  if (iVar1 < 1) {
    iVar1 = -iVar1;
    this_00 = &local_224;
  }
  Bignum::ShiftLeft(this_00,iVar1);
  iVar1 = Bignum::Compare(&local_224,&local_428);
  return iVar1;
}

Assistant:

static int CompareBufferWithDiyFp(Vector<const char> buffer,
                                  int exponent,
                                  DiyFp diy_fp) {
  DOUBLE_CONVERSION_ASSERT(buffer.length() + exponent <= kMaxDecimalPower + 1);
  DOUBLE_CONVERSION_ASSERT(buffer.length() + exponent > kMinDecimalPower);
  DOUBLE_CONVERSION_ASSERT(buffer.length() <= kMaxSignificantDecimalDigits);
  // Make sure that the Bignum will be able to hold all our numbers.
  // Our Bignum implementation has a separate field for exponents. Shifts will
  // consume at most one bigit (< 64 bits).
  // ln(10) == 3.3219...
  DOUBLE_CONVERSION_ASSERT(((kMaxDecimalPower + 1) * 333 / 100) < Bignum::kMaxSignificantBits);
  Bignum buffer_bignum;
  Bignum diy_fp_bignum;
  buffer_bignum.AssignDecimalString(buffer);
  diy_fp_bignum.AssignUInt64(diy_fp.f());
  if (exponent >= 0) {
    buffer_bignum.MultiplyByPowerOfTen(exponent);
  } else {
    diy_fp_bignum.MultiplyByPowerOfTen(-exponent);
  }
  if (diy_fp.e() > 0) {
    diy_fp_bignum.ShiftLeft(diy_fp.e());
  } else {
    buffer_bignum.ShiftLeft(-diy_fp.e());
  }
  return Bignum::Compare(buffer_bignum, diy_fp_bignum);
}